

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int ecp_safe_invert_jac(mbedtls_ecp_group *grp,mbedtls_ecp_point *Q,uchar inv)

{
  int iVar1;
  mbedtls_mpi *B;
  byte assign;
  mbedtls_mpi mQY;
  mbedtls_mpi mStack_38;
  
  mbedtls_mpi_init(&mStack_38);
  B = &Q->Y;
  iVar1 = mbedtls_mpi_sub_mpi(&mStack_38,&grp->P,B);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_int(B,0);
    assign = inv & 1;
    if (iVar1 == 0) {
      assign = 0;
    }
    iVar1 = mbedtls_mpi_safe_cond_assign(B,&mStack_38,assign);
  }
  mbedtls_mpi_free(&mStack_38);
  return iVar1;
}

Assistant:

static int ecp_safe_invert_jac( const mbedtls_ecp_group *grp,
                            mbedtls_ecp_point *Q,
                            unsigned char inv )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char nonzero;
    mbedtls_mpi mQY;

    mbedtls_mpi_init( &mQY );

    /* Use the fact that -Q.Y mod P = P - Q.Y unless Q.Y == 0 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_mpi( &mQY, &grp->P, &Q->Y ) );
    nonzero = mbedtls_mpi_cmp_int( &Q->Y, 0 ) != 0;
    MBEDTLS_MPI_CHK( mbedtls_mpi_safe_cond_assign( &Q->Y, &mQY, inv & nonzero ) );

cleanup:
    mbedtls_mpi_free( &mQY );

    return( ret );
}